

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O1

TValue * luaH_get(Table *t,TValue *key)

{
  double dVar1;
  double dVar2;
  int iVar3;
  Node *pNVar4;
  TValue *unaff_R14;
  
  iVar3 = key->tt;
  if (iVar3 != 0) {
    if (iVar3 == 3) {
      dVar1 = (key->value).n;
      dVar2 = (double)(int)dVar1;
      if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
        unaff_R14 = luaH_getnum(t,(int)dVar1);
      }
      if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
        return unaff_R14;
      }
    }
    else if (iVar3 == 4) {
      pNVar4 = t->node + (~(-1 << (t->lsizenode & 0x1f)) & *(uint *)((long)(key->value).gc + 0xc));
      do {
        if (((pNVar4->i_key).nk.tt == 4) && ((pNVar4->i_key).nk.value.gc == (key->value).gc)) {
          return &pNVar4->i_val;
        }
        pNVar4 = *(Node **)((long)&pNVar4->i_key + 0x10);
      } while (pNVar4 != (Node *)0x0);
      goto LAB_001147d3;
    }
    pNVar4 = mainposition(t,key);
    do {
      iVar3 = luaO_rawequalObj(&(pNVar4->i_key).tvk,key);
      if (iVar3 != 0) {
        return &pNVar4->i_val;
      }
      pNVar4 = *(Node **)((long)&pNVar4->i_key + 0x10);
    } while (pNVar4 != (Node *)0x0);
  }
LAB_001147d3:
  return &luaO_nilobject_;
}

Assistant:

const TValue *luaH_get (Table *t, const TValue *key) {
  switch (ttype(key)) {
    case LUA_TNIL: return luaO_nilobject;
    case LUA_TSTRING: return luaH_getstr(t, rawtsvalue(key));
    case LUA_TNUMBER: {
      int k;
      lua_Number n = nvalue(key);
      lua_number2int(k, n);
      if (luai_numeq(cast_num(k), nvalue(key))) /* index is int? */
        return luaH_getnum(t, k);  /* use specialized version */
      /* else go through */
    }
    default: {
      Node *n = mainposition(t, key);
      do {  /* check whether `key' is somewhere in the chain */
        if (luaO_rawequalObj(key2tval(n), key))
          return gval(n);  /* that's it */
        else n = gnext(n);
      } while (n);
      return luaO_nilobject;
    }
  }
}